

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O3

_Bool run_PPU_cycle(void)

{
  uint16_t scanline;
  uint16_t dot;
  uint16_t uVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  _Bool _Var5;
  uint16_t uVar6;
  byte bVar7;
  ushort uVar8;
  uint8_t *puVar9;
  ushort uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  ushort local_44;
  
  uVar1 = ::scanline;
  bVar11 = ::scanline < 0xf0;
  bVar13 = ::scanline == 0x105;
  bVar12 = (ushort)(::dot - 1) < 0x100;
  local_44 = ::dot - 0x102;
  uVar10 = ::dot & 7;
  uVar8 = ::dot - 0x141;
  bVar2 = debug_read_RAM(0x2000);
  bVar3 = debug_read_RAM(0x2001);
  dot = ::dot;
  scanline = ::scanline;
  if ((bVar3 & 0x18) == 0) goto LAB_0010be03;
  uVar6 = get_VRAM_address();
  if (uVar1 < 0xf0) {
    if (bVar12) {
      render_pixel((BG_shift_registers *)&execute_ppu_background_regs,scanline,dot);
    }
LAB_0010bb03:
    if (0xff06 < local_44 && uVar10 == 1) {
      bVar7 = DAT_00151170._1_1_ >> ((char)uVar6 - 1U & 2 | (byte)(uVar6 >> 4) & 4);
      execute_ppu_background_regs =
           CONCAT12((char)(DAT_0015116c >> 0x18),(ushort)(byte)(DAT_0015116c >> 0x10)) |
           execute_ppu_background_regs;
      DAT_0015116c = CONCAT31(DAT_0015116c._1_3_,bVar7) & 0xffffff01;
      DAT_0015116c = CONCAT22(DAT_0015116c._2_2_,CONCAT11(bVar7 >> 1,(undefined1)DAT_0015116c)) &
                     0xffff01ff;
    }
    if (bVar12) {
      switch(dot & 7) {
      case 1:
        uVar6 = uVar6 & 0xfff | 0x2000;
        puVar9 = (uint8_t *)&DAT_00151170;
        break;
      default:
        goto switchD_0010bb9f_caseD_2;
      case 3:
        uVar6 = (uVar6 >> 2 & 7) + (uVar6 >> 4 & 0x38 | uVar6 & 0xc00) + 0x23c0;
        puVar9 = (uint8_t *)((long)&DAT_00151170 + 1);
        break;
      case 5:
        uVar6 = (DAT_00151170 << 4 | uVar6 >> 0xc) & 0xff7 | (ushort)(bVar2 & 0x10) << 8;
        puVar9 = (uint8_t *)((long)&DAT_0015116c + 3);
        break;
      case 7:
        puVar9 = (uint8_t *)((long)&DAT_0015116c + 2);
        uVar6 = (DAT_00151170 & 0xff) << 4 | uVar6 >> 0xc | (ushort)(bVar2 & 0x10) << 8 | 8;
      }
      uVar4 = read_VRAM(uVar6);
      *puVar9 = uVar4;
    }
  }
  else if (bVar11 || bVar13) goto LAB_0010bb03;
switchD_0010bb9f_caseD_2:
  if ((ushort)(dot - 2) < 0x100 || (ushort)(dot - 0x142) < 0x10) {
    execute_ppu_background_regs =
         CONCAT22(execute_ppu_background_regs._2_2_ * 2,(short)execute_ppu_background_regs * 2);
    auVar14 = ZEXT716(CONCAT52(CONCAT41((int)(((uint7)CONCAT21((short)(((uint7)(byte)(DAT_0015116c
                                                                                     >> 0x18) <<
                                                                       0x30) >> 0x28),
                                                               (char)(DAT_0015116c >> 0x10)) << 0x20
                                              ) >> 0x18),(char)(DAT_0015116c >> 8)),
                               (ushort)(byte)DAT_0015116c));
    auVar14 = pshuflw(auVar14,auVar14,0xe1);
    DAT_00151168 = auVar14._0_4_ | CONCAT22(DAT_00151168._2_2_ * 2,(short)DAT_00151168 * 2);
  }
  if (!bVar11 && !bVar13) goto LAB_0010be03;
  if ((ushort)(::dot - 1) < 0x40) {
    secondary_OAM_clear(dot);
  }
  if ((uVar1 < 0xf0) && ((ushort)(::dot - 0x41) < 0xc0)) {
    sprite_evaluation(scanline,dot,((bVar2 & 0x20) >> 5) * '\b' + '\b');
  }
  if (0x13f < dot) {
    set_OAM_address('\0');
  }
  if ((ushort)(::dot - 0x101) < 0x40) {
    do_sprite_load(scanline,dot,0,((bVar2 & 0x20) >> 5) * '\b' + '\b');
  }
  if (dot == 0x100) {
    incrementY();
  }
  if (bVar12) {
    if ((dot & 7) == 0) {
LAB_0010bd99:
      incrementX();
    }
  }
  else if (uVar8 < 0x10 && (dot & 7) == 0) goto LAB_0010bd99;
  if (dot == 0x101) {
    copyX();
  }
  else if ((ushort)(dot - 0x118) < 0x19 && uVar1 == 0x105) {
    copyY();
  }
  else if (dot == 0x42 && uVar1 == 0x105) {
    clear_sprite0();
  }
  else if (dot == 1 && uVar1 == 0x105) {
    clear_sprite_zero_hit();
    clear_sprite_overflow();
  }
LAB_0010be03:
  if (((bVar3 & 8) == 0) || ((::dot == 0x153 & odd_frame & bVar13) != 1)) {
    uVar1 = ::dot + 1;
    if (0x154 < (ushort)(::dot + 1)) {
      if (bVar13) {
        odd_frame = (_Bool)(odd_frame ^ 1);
        ::scanline = 0;
        ::dot = ::dot - 0x154;
        return (_Bool)check_VBlank_vblank;
      }
      ::scanline = ::scanline + 1;
      uVar1 = ::dot - 0x154;
    }
    ::dot = uVar1;
    if (::dot == 1 && ::scanline == 0xf1) {
      set_vblank_bit();
      check_VBlank_vblank = 1;
      _Var5 = is_NMI_set_in_RAM();
      if (_Var5) {
        NMI_flag = 1;
      }
    }
    else if (::scanline == 0x105 && ::dot == 1) {
      clear_vblank_bit();
      check_VBlank_vblank = 0;
    }
  }
  else {
    ::scanline = 0;
    ::dot = 0;
    odd_frame = (_Bool)(odd_frame ^ 1);
  }
  return (_Bool)check_VBlank_vblank;
}

Assistant:

bool run_PPU_cycle() {
    line_status status = get_ppu_line_status(scanline, dot);
    ppu_regs ppu_regs = get_ppu_registers();

    if(is_rendering_enabled(ppu_regs))
        execute_ppu(&ppu_regs, &status, scanline, dot);

    tick(ppu_regs, status, &scanline, &dot);
    return check_VBlank(ppu_regs, scanline, dot, &NMI_flag);
}